

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O1

void duckdb::AggregateFunction::
     StateInitialize<duckdb::AvgState<duckdb::hugeint_t>,duckdb::DiscreteAverageOperation,(duckdb::AggregateDestructorType)0>
               (AggregateFunction *param_1,data_ptr_t state)

{
  hugeint_t local_20;
  
  hugeint_t::hugeint_t(&local_20,0);
  *(uint64_t *)(state + 8) = local_20.lower;
  *(int64_t *)(state + 0x10) = local_20.upper;
  state[0] = '\0';
  state[1] = '\0';
  state[2] = '\0';
  state[3] = '\0';
  state[4] = '\0';
  state[5] = '\0';
  state[6] = '\0';
  state[7] = '\0';
  return;
}

Assistant:

static void StateInitialize(const AggregateFunction &, data_ptr_t state) {
		// FIXME: we should remove the "destructor_type" option in the future
#if !defined(__GNUC__) || (__GNUC__ >= 5)
		static_assert(std::is_trivially_move_constructible<STATE>::value ||
		                  destructor_type == AggregateDestructorType::LEGACY,
		              "Aggregate state must be trivially move constructible");
#endif
		OP::Initialize(*reinterpret_cast<STATE *>(state));
	}